

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall glslang::TType::TType(TType *this,TType *type,int derefIndex,bool rowMajor)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  TTypeList *pTVar4;
  TArraySizes *this_00;
  uint uVar5;
  TType *s;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_00a5b280;
  iVar3 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar3 == '\0') {
    if ((byte)type->field_0x8 - 0xf < 2) {
      pTVar4 = getStruct(type);
      shallowCopy(this,(pTVar4->
                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
                       .
                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start[derefIndex].type);
      return;
    }
    shallowCopy(this,type);
    uVar1 = *(uint *)&this->field_0x8;
    uVar5 = uVar1 >> 0xc & 0xf;
    if (uVar5 == 0) {
      iVar3 = (*this->_vptr_TType[0x1b])(this);
      uVar1 = *(uint *)&this->field_0x8;
      if ((char)iVar3 == '\0') {
        if ((uVar1 & 0x8600000) != 0) {
          *(uint *)&this->field_0x8 = uVar1 & 0xf01fffff;
          this->typeParameters = (TTypeParameters *)0x0;
        }
      }
      else {
        *(uint *)&this->field_0x8 = uVar1 & 0xffeff0ff | 0x100;
      }
    }
    else {
      uVar5 = uVar5 << 8;
      if (!rowMajor) {
        uVar5 = uVar1 >> 8 & 0xf00;
      }
      *(uint *)&this->field_0x8 = uVar1 & 0xfff000ff | uVar5;
      if (uVar5 == 0x100) {
        *(uint *)&this->field_0x8 = (uVar1 & 0xfffff0ff | uVar5) & 0xffe001ff | 0x100000;
      }
    }
  }
  else {
    s = type;
    shallowCopy(this,type);
    iVar3 = (*type->_vptr_TType[0x13])(type);
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 8);
    if ((lVar2 == 0) || ((*(long *)(lVar2 + 0x10) - *(long *)(lVar2 + 8) & 0xffffffff0U) != 0x10)) {
      this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)s);
      (this_00->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00a5b8c8;
      (this_00->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      this_00->implicitArraySize = 0;
      this_00->implicitlySized = true;
      this_00->variablyIndexed = false;
      this->arraySizes = this_00;
      TArraySizes::copyDereferenced(this_00,type->arraySizes);
      return;
    }
    this->arraySizes = (TArraySizes *)0x0;
  }
  return;
}

Assistant:

TType(const TType& type, int derefIndex, bool rowMajor = false)
                            {
                                if (type.isArray()) {
                                    shallowCopy(type);
                                    if (type.getArraySizes()->getNumDims() == 1) {
                                        arraySizes = nullptr;
                                    } else {
                                        // want our own copy of the array, so we can edit it
                                        arraySizes = new TArraySizes;
                                        arraySizes->copyDereferenced(*type.arraySizes);
                                    }
                                } else if (type.basicType == EbtStruct || type.basicType == EbtBlock) {
                                    // do a structure dereference
                                    const TTypeList& memberList = *type.getStruct();
                                    shallowCopy(*memberList[derefIndex].type);
                                    return;
                                } else {
                                    // do a vector/matrix dereference
                                    shallowCopy(type);
                                    if (matrixCols > 0) {
                                        // dereference from matrix to vector
                                        if (rowMajor)
                                            vectorSize = matrixCols;
                                        else
                                            vectorSize = matrixRows;
                                        matrixCols = 0;
                                        matrixRows = 0;
                                        if (vectorSize == 1)
                                            vector1 = true;
                                    } else if (isVector()) {
                                        // dereference from vector to scalar
                                        vectorSize = 1;
                                        vector1 = false;
                                    } else if (isCoopMat() || isCoopVecNV()) {
                                        coopmatNV = false;
                                        coopmatKHR = false;
                                        coopmatKHRuse = 0;
                                        coopmatKHRUseValid = false;
                                        coopvecNV = false;
                                        typeParameters = nullptr;
                                    }
                                }
                            }